

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryReverse(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  RecyclableObject *pRVar3;
  bool bVar4;
  int n;
  CallFlags e;
  uint32 length_00;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var arg;
  uint64 length_01;
  RecyclableObject *local_a0;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  BigIndex length;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x15a5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar6);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x15a9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec42,L"Array.prototype.reverse");
  }
  BigIndex::BigIndex((BigIndex *)&pArr,0);
  obj = (RecyclableObject *)0x0;
  local_a0 = (RecyclableObject *)0x0;
  JsReentLock::unlock((JsReentLock *)local_70);
  arg = Arguments::operator[]((Arguments *)&scriptContext,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (arg,(ScriptContext *)jsReentLock._24_8_,L"Array.prototype.reverse",
             (JavascriptArray **)&obj,&local_a0,(BigIndex *)&pArr);
  JsReentLock::MutateArrayObject((JsReentLock *)local_70);
  JsReentLock::relock((JsReentLock *)local_70);
  bVar4 = BigIndex::IsSmallIndex((BigIndex *)&pArr);
  if (bVar4) {
    JsReentLock::unlock((JsReentLock *)local_70);
    pRVar3 = obj;
    pRVar2 = local_a0;
    length_00 = BigIndex::GetSmallIndex((BigIndex *)&pArr);
    callInfo_local =
         (CallInfo)
         ReverseHelper<unsigned_int>
                   ((JavascriptArray *)pRVar3,(TypedArrayBase *)0x0,pRVar2,length_00,
                    (ScriptContext *)jsReentLock._24_8_);
  }
  else {
    JsReentLock::unlock((JsReentLock *)local_70);
    pRVar3 = obj;
    pRVar2 = local_a0;
    length_01 = BigIndex::GetBigIndex((BigIndex *)&pArr);
    callInfo_local =
         (CallInfo)
         ReverseHelper<unsigned_long>
                   ((JavascriptArray *)pRVar3,(TypedArrayBase *)0x0,pRVar2,length_01,
                    (ScriptContext *)jsReentLock._24_8_);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_70);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArray::EntryReverse(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Reverse);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.reverse"));
        }

        BigIndex length = 0u;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.reverse"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReverseHelper(pArr, nullptr, obj, length.GetSmallIndex(), scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReverseHelper(pArr, nullptr, obj, length.GetBigIndex(), scriptContext));
        JIT_HELPER_END(Array_Reverse);
    }